

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::BayesianProbitRegressor_Gaussian::MergeFrom
          (BayesianProbitRegressor_Gaussian *this,BayesianProbitRegressor_Gaussian *from)

{
  double dVar1;
  void *pvVar2;
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O1/mlmodel/format/BayesianProbitRegressor.pb.cc"
               ,0x108);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  dVar1 = from->mean_;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    this->mean_ = dVar1;
  }
  dVar1 = from->precision_;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    this->precision_ = dVar1;
  }
  return;
}

Assistant:

void BayesianProbitRegressor_Gaussian::MergeFrom(const BayesianProbitRegressor_Gaussian& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.BayesianProbitRegressor.Gaussian)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.mean() != 0) {
    set_mean(from.mean());
  }
  if (from.precision() != 0) {
    set_precision(from.precision());
  }
}